

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

void __thiscall wasm::TypeBuilder::Impl::Entry::set(Entry *this,HeapTypeInfo *hti)

{
  HeapTypeKind HVar1;
  pointer pHVar2;
  HeapTypeInfo *hti_local;
  Entry *this_local;
  
  HVar1 = hti->kind;
  pHVar2 = std::
           unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
           ::operator->(&this->info);
  pHVar2->kind = HVar1;
  pHVar2 = std::
           unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
           ::operator->(&this->info);
  switch(pHVar2->kind) {
  case Basic:
    handle_unreachable("unexpected kind",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                       ,0x8dd);
  case Func:
    pHVar2 = std::
             unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
             ::operator->(&this->info);
    (pHVar2->field_9).signature.params.id = (hti->field_9).signature.params.id;
    (pHVar2->field_9).signature.results.id = (hti->field_9).signature.results.id;
    break;
  case Struct:
    pHVar2 = std::
             unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
             ::operator->(&this->info);
    Struct::operator=(&(pHVar2->field_9).struct_,&(hti->field_9).struct_);
    break;
  case Array:
    pHVar2 = std::
             unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
             ::operator->(&this->info);
    (pHVar2->field_9).signature.params.id = (hti->field_9).signature.params.id;
    (pHVar2->field_9).signature.results.id = (hti->field_9).signature.results.id;
    break;
  case Cont:
    pHVar2 = std::
             unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
             ::operator->(&this->info);
    (pHVar2->field_9).signature.params.id = (hti->field_9).signature.params.id;
  }
  this->initialized = true;
  return;
}

Assistant:

void set(HeapTypeInfo&& hti) {
      info->kind = hti.kind;
      switch (info->kind) {
        case HeapTypeKind::Func:
          info->signature = hti.signature;
          break;
        case HeapTypeKind::Cont:
          info->continuation = hti.continuation;
          break;
        case HeapTypeKind::Struct:
          info->struct_ = std::move(hti.struct_);
          break;
        case HeapTypeKind::Array:
          info->array = hti.array;
          break;
        case HeapTypeKind::Basic:
          WASM_UNREACHABLE("unexpected kind");
      }
      initialized = true;
    }